

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloc.cc
# Opt level: O0

void * raptor::ZeroAlloc(size_t size)

{
  void *p;
  size_t size_local;
  
  if (size == 0) {
    size_local = 0;
  }
  else {
    size_local = (size_t)calloc(size,1);
    if ((void *)size_local == (void *)0x0) {
      abort();
    }
  }
  return (void *)size_local;
}

Assistant:

void* ZeroAlloc(size_t size) {
    if (size > 0) {
        void* p = ::calloc(size, 1);
        if (!p) {
            abort();
        }
        return p;
    }
    return nullptr;
}